

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O2

void cmn_live_set(cmn_t *cmn,mfcc_t *vec)

{
  float fVar1;
  int iVar2;
  long lVar3;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x37,"Update from < ");
  for (lVar3 = 0; lVar3 < cmn->veclen; lVar3 = lVar3 + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar3]);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  iVar2 = cmn->veclen;
  for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
    fVar1 = (float)vec[lVar3];
    cmn->cmn_mean[lVar3] = (mfcc_t)fVar1;
    cmn->sum[lVar3] = (mfcc_t)(fVar1 * 500.0);
  }
  cmn->nframe = 500;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x42,"Update to   < ");
  for (lVar3 = 0; lVar3 < cmn->veclen; lVar3 = lVar3 + 1) {
    err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar3]);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  return;
}

Assistant:

void
cmn_live_set(cmn_t *cmn, mfcc_t const * vec)
{
    int32 i;

    E_INFO("Update from < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");

    for (i = 0; i < cmn->veclen; i++) {
        cmn->cmn_mean[i] = vec[i];
        cmn->sum[i] = vec[i] * CMN_WIN;
    }
    cmn->nframe = CMN_WIN;

    E_INFO("Update to   < ");
    for (i = 0; i < cmn->veclen; i++)
        E_INFOCONT("%5.2f ", MFCC2FLOAT(cmn->cmn_mean[i]));
    E_INFOCONT(">\n");
}